

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O0

void Emb_ManDerivePlacement(Emb_Man_t *p,int nSols)

{
  int iVar1;
  float *pArray;
  float *pArray_00;
  int *__ptr;
  int *__ptr_00;
  unsigned_short *puVar2;
  float fVar3;
  int local_54;
  int k;
  int *pPerm1;
  int *pPerm0;
  float Str1;
  float Str0;
  float Min1;
  float Min0;
  float Max1;
  float Max0;
  float *pY1;
  float *pY0;
  int nSols_local;
  Emb_Man_t *p_local;
  
  if (nSols == 2) {
    Str0 = 1e+09;
    Min0 = -1e+09;
    pArray = Emb_ManSol(p,0);
    for (local_54 = 0; local_54 < p->nObjs; local_54 = local_54 + 1) {
      iVar1 = Abc_MinInt((int)Str0,(int)pArray[local_54]);
      Str0 = (float)iVar1;
      iVar1 = Abc_MaxInt((int)Min0,(int)pArray[local_54]);
      Min0 = (float)iVar1;
    }
    for (local_54 = 0; local_54 < p->nObjs; local_54 = local_54 + 1) {
      if ((pArray[local_54] != 0.0) || (NAN(pArray[local_54]))) {
        fVar3 = (pArray[local_54] - Str0) * (32767.0 / (Min0 - Str0));
      }
      else {
        fVar3 = 0.0;
      }
      pArray[local_54] = fVar3;
    }
    Str1 = 1e+09;
    Min1 = -1e+09;
    pArray_00 = Emb_ManSol(p,1);
    for (local_54 = 0; local_54 < p->nObjs; local_54 = local_54 + 1) {
      iVar1 = Abc_MinInt((int)Str1,(int)pArray_00[local_54]);
      Str1 = (float)iVar1;
      iVar1 = Abc_MaxInt((int)Min1,(int)pArray_00[local_54]);
      Min1 = (float)iVar1;
    }
    for (local_54 = 0; local_54 < p->nObjs; local_54 = local_54 + 1) {
      if ((pArray_00[local_54] != 0.0) || (NAN(pArray_00[local_54]))) {
        fVar3 = (pArray_00[local_54] - Str1) * (32767.0 / (Min1 - Str1));
      }
      else {
        fVar3 = 0.0;
      }
      pArray_00[local_54] = fVar3;
    }
    __ptr = Gia_SortFloats(pArray,(int *)0x0,p->nObjs);
    __ptr_00 = Gia_SortFloats(pArray_00,(int *)0x0,p->nObjs);
    puVar2 = (unsigned_short *)malloc((long)(p->nObjs << 1) << 1);
    p->pPlacement = puVar2;
    for (local_54 = 0; local_54 < p->nObjs; local_54 = local_54 + 1) {
      p->pPlacement[__ptr[local_54] << 1] =
           (unsigned_short)(int)(((double)local_54 * 1.0 * 32767.0) / (double)p->nObjs);
      p->pPlacement[__ptr_00[local_54] * 2 + 1] =
           (unsigned_short)(int)(((double)local_54 * 1.0 * 32767.0) / (double)p->nObjs);
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (int *)0x0) {
      free(__ptr_00);
    }
  }
  return;
}

Assistant:

void Emb_ManDerivePlacement( Emb_Man_t * p, int nSols )
{
    float * pY0, * pY1, Max0, Max1, Min0, Min1, Str0, Str1;
    int * pPerm0, * pPerm1;
    int k;
    if ( nSols != 2 )
        return;
    // compute intervals
    Min0 =  ABC_INFINITY;
    Max0 = -ABC_INFINITY;
    pY0 = Emb_ManSol( p, 0 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min0 = Abc_MinInt( Min0, pY0[k] );
        Max0 = Abc_MaxInt( Max0, pY0[k] );
    }
    Str0 = 1.0*GIA_PLACE_SIZE/(Max0 - Min0);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY0[k] = (pY0[k] != 0.0) ? ((pY0[k] - Min0) * Str0) : 0.0;

    // compute intervals
    Min1 =  ABC_INFINITY;
    Max1 = -ABC_INFINITY;
    pY1 = Emb_ManSol( p, 1 );
    for ( k = 0; k < p->nObjs; k++ )
    {
        Min1 = Abc_MinInt( Min1, pY1[k] );
        Max1 = Abc_MaxInt( Max1, pY1[k] );
    }
    Str1 = 1.0*GIA_PLACE_SIZE/(Max1 - Min1);
    // update the coordinates
    for ( k = 0; k < p->nObjs; k++ )
        pY1[k] = (pY1[k] != 0.0) ? ((pY1[k] - Min1) * Str1) : 0.0;

    // derive the order of these numbers
    pPerm0 = Gia_SortFloats( pY0, NULL, p->nObjs );
    pPerm1 = Gia_SortFloats( pY1, NULL, p->nObjs );

    // average solutions and project them into square [0;GIA_PLACE_SIZE] x [0;GIA_PLACE_SIZE]
    p->pPlacement = ABC_ALLOC( unsigned short, 2 * p->nObjs );
    for ( k = 0; k < p->nObjs; k++ )
    {
        p->pPlacement[2*pPerm0[k]+0] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
        p->pPlacement[2*pPerm1[k]+1] = (unsigned short)(int)(1.0 * k * GIA_PLACE_SIZE / p->nObjs);
    }
    ABC_FREE( pPerm0 );
    ABC_FREE( pPerm1 );
}